

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_softsynth_mididevice.cpp
# Opt level: O1

void __thiscall SoftSynthMIDIDevice::SoftSynthMIDIDevice(SoftSynthMIDIDevice *this)

{
  int iVar1;
  SDL_mutex *pSVar2;
  float extraout_XMM0_Da;
  
  MIDIDevice::MIDIDevice(&this->super_MIDIDevice);
  (this->super_MIDIDevice)._vptr_MIDIDevice = (_func_int **)&PTR__SoftSynthMIDIDevice_006f4e98;
  pSVar2 = (SDL_mutex *)SDL_CreateMutex();
  (this->CritSec).CritSec = pSVar2;
  if (pSVar2 == (SDL_mutex *)0x0) {
    I_FatalError("Failed to create a critical section mutex.");
  }
  this->Events = (MIDIHDR *)0x0;
  this->Started = false;
  this->Stream = (SoundStream *)0x0;
  this->Tempo = 0.0;
  this->Division = 0.0;
  if (GSnd == (SoundRenderer *)0x0) {
    iVar1 = 0xac44;
  }
  else {
    (*GSnd->_vptr_SoundRenderer[10])();
    iVar1 = (int)extraout_XMM0_Da;
  }
  this->SampleRate = iVar1;
  return;
}

Assistant:

SoftSynthMIDIDevice::SoftSynthMIDIDevice()
{
	Stream = NULL;
	Tempo = 0;
	Division = 0;
	Events = NULL;
	Started = false;
	SampleRate = GSnd != NULL ? (int)GSnd->GetOutputRate() : 44100;
}